

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

void Js::JavascriptBigInt::AddAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  Type TVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  bool bVar12;
  
  if (pbi1->m_length < pbi2->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1c4,"(pbi1->m_length >= pbi2->m_length)",
                                "pbi1->m_length >= pbi2->m_length");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  puVar2 = (pbi1->m_digits).ptr;
  if (pbi2->m_length == 0) {
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    puVar3 = (pbi2->m_digits).ptr;
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar10 = puVar3[uVar8];
      bVar6 = CARRY8(uVar10,puVar2[uVar8]);
      uVar10 = uVar10 + puVar2[uVar8];
      bVar12 = CARRY8(uVar10,uVar9);
      uVar11 = uVar10 + uVar9;
      uVar9 = (ulong)bVar6 + 1;
      if (!bVar12) {
        uVar9 = (ulong)bVar6;
      }
      puVar2[uVar8] = uVar11;
      uVar8 = uVar8 + 1;
    } while (uVar8 < pbi2->m_length);
  }
  uVar10 = pbi1->m_length;
  bVar6 = uVar9 != 0;
  if ((uVar8 < uVar10) && (uVar9 != 0)) {
    do {
      puVar1 = puVar2 + uVar8;
      bVar6 = CARRY8(*puVar1,uVar9);
      *puVar1 = *puVar1 + uVar9;
      uVar9 = (ulong)bVar6;
      uVar10 = pbi1->m_length;
      if (uVar10 <= uVar8 + 1) break;
      uVar8 = uVar8 + 1;
    } while (bVar6);
  }
  if (bVar6) {
    if (pbi1->m_maxLength <= uVar10) {
      Resize(pbi1,uVar10 + 1);
    }
    puVar2 = (pbi1->m_digits).ptr;
    TVar4 = pbi1->m_length;
    pbi1->m_length = TVar4 + 1;
    puVar2[TVar4] = uVar9;
  }
  return;
}

Assistant:

void JavascriptBigInt::AddAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->m_length >= pbi2->m_length);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        if (0 < carryDigit) // length increase by 1
        {
            if (pbi1->m_length >= pbi1->m_maxLength)
            {
                pbi1->Resize(pbi1->m_length + 1);
            }
            pbi1->m_digits[pbi1->m_length++] = carryDigit;
        }
    }